

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SolverParameter::MergeFrom(SolverParameter *this,SolverParameter *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  NetParameter *pNVar4;
  NetParameter *pNVar5;
  NetState *this_00;
  NetState *from_00;
  InternalMetadataWithArena *this_01;
  LogFinisher local_105;
  uint32 cached_has_bits;
  byte local_f1;
  LogMessage local_f0;
  SolverParameter *local_b8;
  SolverParameter *from_local;
  SolverParameter *this_local;
  InternalMetadataWithArena *local_a0;
  InternalMetadataWithArena *local_98;
  undefined4 local_3c;
  HasBits<2UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_f1 = 0;
  local_b8 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x2171);
    local_f1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_f0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_105,other);
  }
  if ((local_f1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_f0);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (SolverParameter *)&local_b8->_internal_metadata_;
  local_a0 = this_01;
  local_98 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_01,&local_28->unknown_fields);
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->test_net_,&local_b8->test_net_);
  google::protobuf::RepeatedField<int>::MergeFrom(&this->test_iter_,&local_b8->test_iter_);
  google::protobuf::RepeatedPtrField<caffe::NetParameter>::MergeFrom
            (&this->test_net_param_,&local_b8->test_net_param_);
  google::protobuf::RepeatedPtrField<caffe::NetState>::MergeFrom
            (&this->test_state_,&local_b8->test_state_);
  google::protobuf::RepeatedField<int>::MergeFrom(&this->stepvalue_,&local_b8->stepvalue_);
  local_38 = &local_b8->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_train_net(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->train_net_,psVar2,(local_b8->train_net_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_lr_policy(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->lr_policy_,psVar2,(local_b8->lr_policy_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_snapshot_prefix(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->snapshot_prefix_,psVar2,(local_b8->snapshot_prefix_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      set_has_net(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->net_,psVar2,(local_b8->net_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      set_has_regularization_type(this);
      pbVar3 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)_default_regularization_type__abi_cxx11_);
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->regularization_type_,pbVar3,(local_b8->regularization_type_).ptr_);
    }
    if ((uVar1 & 0x20) != 0) {
      set_has_type(this);
      pbVar3 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)_default_type__abi_cxx11_);
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->type_,pbVar3,(local_b8->type_).ptr_);
    }
    if ((uVar1 & 0x40) != 0) {
      pNVar4 = mutable_train_net_param(this);
      pNVar5 = train_net_param(local_b8);
      NetParameter::MergeFrom(pNVar4,pNVar5);
    }
    if ((uVar1 & 0x80) != 0) {
      pNVar4 = mutable_net_param(this);
      pNVar5 = net_param(local_b8);
      NetParameter::MergeFrom(pNVar4,pNVar5);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this_00 = mutable_train_state(this);
      from_00 = train_state(local_b8);
      NetState::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 0x200) != 0) {
      this->test_interval_ = local_b8->test_interval_;
    }
    if ((uVar1 & 0x400) != 0) {
      this->base_lr_ = local_b8->base_lr_;
    }
    if ((uVar1 & 0x800) != 0) {
      this->display_ = local_b8->display_;
    }
    if ((uVar1 & 0x1000) != 0) {
      this->max_iter_ = local_b8->max_iter_;
    }
    if ((uVar1 & 0x2000) != 0) {
      this->gamma_ = local_b8->gamma_;
    }
    if ((uVar1 & 0x4000) != 0) {
      this->power_ = local_b8->power_;
    }
    if ((uVar1 & 0x8000) != 0) {
      this->momentum_ = local_b8->momentum_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      this->weight_decay_ = local_b8->weight_decay_;
    }
    if ((uVar1 & 0x20000) != 0) {
      this->stepsize_ = local_b8->stepsize_;
    }
    if ((uVar1 & 0x40000) != 0) {
      this->snapshot_ = local_b8->snapshot_;
    }
    if ((uVar1 & 0x80000) != 0) {
      this->device_id_ = local_b8->device_id_;
    }
    if ((uVar1 & 0x100000) != 0) {
      this->test_compute_loss_ = (bool)(local_b8->test_compute_loss_ & 1);
    }
    if ((uVar1 & 0x200000) != 0) {
      this->snapshot_diff_ = (bool)(local_b8->snapshot_diff_ & 1);
    }
    if ((uVar1 & 0x400000) != 0) {
      this->debug_info_ = (bool)(local_b8->debug_info_ & 1);
    }
    if ((uVar1 & 0x800000) != 0) {
      this->solver_type_ = local_b8->solver_type_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      this->momentum2_ = local_b8->momentum2_;
    }
    if ((uVar1 & 0x2000000) != 0) {
      this->random_seed_ = local_b8->random_seed_;
    }
    if ((uVar1 & 0x4000000) != 0) {
      this->solver_mode_ = local_b8->solver_mode_;
    }
    if ((uVar1 & 0x8000000) != 0) {
      this->test_initialization_ = (bool)(local_b8->test_initialization_ & 1);
    }
    if ((uVar1 & 0x10000000) != 0) {
      this->snapshot_after_train_ = (bool)(local_b8->snapshot_after_train_ & 1);
    }
    if ((uVar1 & 0x20000000) != 0) {
      this->delta_ = local_b8->delta_;
    }
    if ((uVar1 & 0x40000000) != 0) {
      this->average_loss_ = local_b8->average_loss_;
    }
    if ((uVar1 & 0x80000000) != 0) {
      this->clip_gradients_ = local_b8->clip_gradients_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  uVar1 = (local_b8->_has_bits_).has_bits_[1];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      this->iter_size_ = local_b8->iter_size_;
    }
    if ((uVar1 & 2) != 0) {
      this->snapshot_format_ = local_b8->snapshot_format_;
    }
    if ((uVar1 & 4) != 0) {
      this->rms_decay_ = local_b8->rms_decay_;
    }
    (this->_has_bits_).has_bits_[1] = uVar1 | (this->_has_bits_).has_bits_[1];
  }
  return;
}

Assistant:

void SolverParameter::MergeFrom(const SolverParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.SolverParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  test_net_.MergeFrom(from.test_net_);
  test_iter_.MergeFrom(from.test_iter_);
  test_net_param_.MergeFrom(from.test_net_param_);
  test_state_.MergeFrom(from.test_state_);
  stepvalue_.MergeFrom(from.stepvalue_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_train_net();
      train_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.train_net_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_lr_policy();
      lr_policy_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.lr_policy_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_snapshot_prefix();
      snapshot_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.snapshot_prefix_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_net();
      net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.net_);
    }
    if (cached_has_bits & 0x00000010u) {
      set_has_regularization_type();
      regularization_type_.AssignWithDefault(&SolverParameter::_default_regularization_type_.get(), from.regularization_type_);
    }
    if (cached_has_bits & 0x00000020u) {
      set_has_type();
      type_.AssignWithDefault(&SolverParameter::_default_type_.get(), from.type_);
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_train_net_param()->::caffe::NetParameter::MergeFrom(from.train_net_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_net_param()->::caffe::NetParameter::MergeFrom(from.net_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_train_state()->::caffe::NetState::MergeFrom(from.train_state());
    }
    if (cached_has_bits & 0x00000200u) {
      test_interval_ = from.test_interval_;
    }
    if (cached_has_bits & 0x00000400u) {
      base_lr_ = from.base_lr_;
    }
    if (cached_has_bits & 0x00000800u) {
      display_ = from.display_;
    }
    if (cached_has_bits & 0x00001000u) {
      max_iter_ = from.max_iter_;
    }
    if (cached_has_bits & 0x00002000u) {
      gamma_ = from.gamma_;
    }
    if (cached_has_bits & 0x00004000u) {
      power_ = from.power_;
    }
    if (cached_has_bits & 0x00008000u) {
      momentum_ = from.momentum_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      weight_decay_ = from.weight_decay_;
    }
    if (cached_has_bits & 0x00020000u) {
      stepsize_ = from.stepsize_;
    }
    if (cached_has_bits & 0x00040000u) {
      snapshot_ = from.snapshot_;
    }
    if (cached_has_bits & 0x00080000u) {
      device_id_ = from.device_id_;
    }
    if (cached_has_bits & 0x00100000u) {
      test_compute_loss_ = from.test_compute_loss_;
    }
    if (cached_has_bits & 0x00200000u) {
      snapshot_diff_ = from.snapshot_diff_;
    }
    if (cached_has_bits & 0x00400000u) {
      debug_info_ = from.debug_info_;
    }
    if (cached_has_bits & 0x00800000u) {
      solver_type_ = from.solver_type_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      momentum2_ = from.momentum2_;
    }
    if (cached_has_bits & 0x02000000u) {
      random_seed_ = from.random_seed_;
    }
    if (cached_has_bits & 0x04000000u) {
      solver_mode_ = from.solver_mode_;
    }
    if (cached_has_bits & 0x08000000u) {
      test_initialization_ = from.test_initialization_;
    }
    if (cached_has_bits & 0x10000000u) {
      snapshot_after_train_ = from.snapshot_after_train_;
    }
    if (cached_has_bits & 0x20000000u) {
      delta_ = from.delta_;
    }
    if (cached_has_bits & 0x40000000u) {
      average_loss_ = from.average_loss_;
    }
    if (cached_has_bits & 0x80000000u) {
      clip_gradients_ = from.clip_gradients_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 7u) {
    if (cached_has_bits & 0x00000001u) {
      iter_size_ = from.iter_size_;
    }
    if (cached_has_bits & 0x00000002u) {
      snapshot_format_ = from.snapshot_format_;
    }
    if (cached_has_bits & 0x00000004u) {
      rms_decay_ = from.rms_decay_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}